

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>>
          (Master *this,ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *f,Skip *s)

{
  Skip *in_stack_00000070;
  Callback<PointBlock<3U>_> *in_stack_00000078;
  Master *in_stack_00000080;
  ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *in_stack_ffffffffffffffb8;
  function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)> *in_stack_ffffffffffffffc0;
  
  std::function<void(PointBlock<3u>*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>const&,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  foreach_<PointBlock<3u>>(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  Catch::clara::std::function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)>::
  ~function((function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)> *)0x1f938f);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }